

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O3

void __thiscall cppcms::impl::garbage_collector::async_run(garbage_collector *this,error_code *e)

{
  ptime pVar1;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_38;
  ptime local_30;
  
  if (e->_M_value == 0) {
    local_30.sec = (longlong)this->seconds_;
    local_30.nsec = 0;
    booster::ptime::normalize(&local_30);
    pVar1._8_8_ = local_30.sec;
    pVar1.sec = (longlong)&this->timer_;
    booster::aio::deadline_timer::expires_from_now(pVar1);
    mfunc_to_event_handler<cppcms::impl::garbage_collector,cppcms::impl::garbage_collector*>
              ((offset_in_garbage_collector_to_subr)&local_38,(garbage_collector *)async_run);
    local_30.sec = (longlong)local_38.p_;
    if (local_38.p_ != (callable<void_(const_std::error_code_&)> *)0x0) {
      booster::atomic_counter::inc();
    }
    booster::aio::deadline_timer::async_wait((callback *)&this->timer_);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_30);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_38);
    (*((this->io_).
       super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_session_storage_factory[2])();
  }
  return;
}

Assistant:

void on_data_in(booster::system::error_code const &e,size_t )
	{
		if(e) {
			handle_error(e);
			return;
		}
		memset(&hout_,0,sizeof(hout_));
		BOOSTER_DEBUG("cppcms_scale") << "Received command " << hin_.opcode << "(" 
			<< opcodes::to_name(hin_.opcode) <<"); fd="<< socket_.native();
		switch(hin_.opcode) {
		case opcodes::fetch:
		case opcodes::rise:
		case opcodes::clear:
		case opcodes::store:
		case opcodes::stats:
			if(!cache_)
				hout_.opcode=opcodes::error;
			break;
		case opcodes::session_save:
		case opcodes::session_load:
		case opcodes::session_remove:
			if(!sessions_)
				hout_.opcode=opcodes::error;
			break;
		default:
			hout_.opcode=opcodes::error;
		}
		if(hout_.opcode!=opcodes::error) {
			switch(hin_.opcode){
			case opcodes::fetch:		fetch(); break;
			case opcodes::rise:		rise(); break;
			case opcodes::clear:		clear(); break;
			case opcodes::store:		store(); break;
			case opcodes::stats:		stats(); break;
			case opcodes::session_save:	save(); break;
			case opcodes::session_load:	load(); break;
			case opcodes::session_remove:	remove(); break;
			default:
				hout_.opcode=opcodes::error;
			}
		}
		BOOSTER_DEBUG("cppcms_scale") << "Returning answer " << hout_.opcode << "(" 
			<< opcodes::to_name(hout_.opcode) <<"); fd="<< socket_.native();
		io::const_buffer packet = io::buffer(&hout_,sizeof(hout_));
		if(hout_.size > 0) {
			packet += io::buffer(data_out_.c_str(),hout_.size);
		}
		socket_.async_write(packet,
			mfunc_to_io_handler(&session::on_data_out,shared_from_this()));
	}